

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O1

void * sndio_mainloop(void *arg)

{
  pthread_mutex_t *__mutex;
  float fVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  pollfd *__fds;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  short *psVar10;
  ulong uVar11;
  undefined8 uVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong local_40;
  
  iVar4 = (*cubeb_sio_nfds)(*(sio_hdl **)((long)arg + 0x40));
  __fds = (pollfd *)calloc((long)iVar4,8);
  if (__fds != (pollfd *)0x0) {
    (**(code **)((long)arg + 0x98))(arg,*(undefined8 *)((long)arg + 8),0);
    __mutex = (pthread_mutex_t *)((long)arg + 0x18);
    pthread_mutex_lock(__mutex);
    iVar4 = (*cubeb_sio_start)(*(sio_hdl **)((long)arg + 0x40));
    if (iVar4 == 0) {
      pthread_mutex_unlock(__mutex);
    }
    else {
      iVar4 = *(int *)((long)arg + 0x68);
      if ((*(uint *)((long)arg + 0x48) & 1) == 0) {
        uVar11 = (ulong)(uint)(iVar4 * *(int *)((long)arg + 0x6c));
        iVar16 = 0;
        uVar5 = 0;
        uVar15 = 0;
      }
      else {
        uVar5 = *(int *)((long)arg + 0x70) * iVar4;
        iVar16 = *(int *)((long)arg + 0x7c);
        if ((*(uint *)((long)arg + 0x48) & 2) == 0) {
          uVar11 = 0;
          uVar15 = 0;
        }
        else {
          memset(*(void **)((long)arg + 0x58),0,(ulong)(uint)(iVar4 * *(int *)((long)arg + 0x6c)));
          uVar11 = (ulong)(uint)(*(int *)((long)arg + 0x6c) * *(int *)((long)arg + 0x68));
          uVar15 = uVar11;
        }
      }
      if (*(int *)((long)arg + 0x4c) != 0) {
        uVar13 = (ulong)uVar5;
        bVar3 = false;
        local_40 = uVar13;
        do {
          uVar5 = *(uint *)((long)arg + 0x48);
          if ((((uVar5 & 1) == 0) || (uVar13 == local_40)) &&
             (((uVar5 & 2) == 0 || (uVar15 == uVar11)))) {
            uVar12 = 2;
            if (bVar3) goto LAB_00121052;
            if ((((uVar5 & 2) != 0) && (*(int *)((long)arg + 0x50) != 0)) &&
               (uVar5 = *(int *)((long)arg + 0x74) * *(int *)((long)arg + 0x68), uVar5 != 0)) {
              lVar7 = *(long *)((long)arg + 0x58);
              lVar6 = (ulong)uVar5 + 1;
              do {
                *(float *)(lVar7 + -8 + lVar6 * 4) =
                     (float)(int)*(short *)(lVar7 + -4 + lVar6 * 2) * 3.0517578e-05;
                lVar6 = lVar6 + -1;
              } while (1 < lVar6);
            }
            pthread_mutex_unlock(__mutex);
            lVar7 = (**(code **)((long)arg + 0x90))
                              (arg,*(undefined8 *)((long)arg + 8),*(undefined8 *)((long)arg + 0x58),
                               *(undefined8 *)((long)arg + 0x60),*(undefined4 *)((long)arg + 0x68));
            pthread_mutex_lock(__mutex);
            if (lVar7 < 0) {
              uVar12 = 3;
              goto LAB_00121052;
            }
            *(long *)((long)arg + 0x88) = *(long *)((long)arg + 0x88) + lVar7;
            bVar3 = false;
            if (lVar7 < (long)(ulong)*(uint *)((long)arg + 0x68)) {
              if (((*(byte *)((long)arg + 0x48) & 1) == 0) || (lVar7 == 0)) goto LAB_00121052;
              local_40 = (ulong)*(uint *)((long)arg + 0x70) * lVar7;
              bVar3 = true;
            }
            if ((*(byte *)((long)arg + 0x48) & 1) != 0) {
              if (*(int *)((long)arg + 0x50) == 0) {
                lVar7 = lVar7 * (ulong)*(uint *)((long)arg + 0x78);
                fVar1 = *(float *)((long)arg + 0xa0);
                if (0 < lVar7) {
                  psVar10 = *(short **)((long)arg + 0x60);
                  lVar7 = lVar7 + 1;
                  do {
                    *psVar10 = (short)((uint)((int)*psVar10 * (int)(fVar1 * 32768.0)) >> 0xf);
                    psVar10 = psVar10 + 1;
                    lVar7 = lVar7 + -1;
                  } while (1 < lVar7);
                }
              }
              else {
                lVar7 = lVar7 * (ulong)*(uint *)((long)arg + 0x78);
                fVar1 = *(float *)((long)arg + 0xa0);
                if (0 < lVar7) {
                  lVar6 = *(long *)((long)arg + 0x60);
                  lVar7 = lVar7 + 1;
                  lVar17 = 0;
                  do {
                    lVar8 = lrintf(*(float *)(lVar6 + lVar17 * 2) * fVar1 * 32768.0);
                    if (0x7ffe < (int)lVar8) {
                      lVar8 = 0x7fff;
                    }
                    if ((int)lVar8 < -0x7fff) {
                      lVar8 = 0xffff8000;
                    }
                    *(short *)(lVar6 + lVar17) = (short)lVar8;
                    lVar7 = lVar7 + -1;
                    lVar17 = lVar17 + 2;
                  } while (1 < lVar7);
                }
              }
            }
            iVar16 = iVar16 - (uint)(0 < iVar16);
            if ((*(uint *)((long)arg + 0x48) & 2) != 0) {
              uVar15 = 0;
            }
            if ((*(uint *)((long)arg + 0x48) & 1) != 0) {
              uVar13 = 0;
            }
          }
          bVar14 = (iVar16 == 0 && (uVar15 <= uVar11 && uVar11 - uVar15 != 0)) &
                   *(byte *)((long)arg + 0x48) >> 1;
          bVar2 = bVar14 + 4;
          if (local_40 < uVar13 || local_40 - uVar13 == 0) {
            bVar2 = bVar14;
          }
          if ((*(byte *)((long)arg + 0x48) & 1) == 0) {
            bVar2 = bVar14;
          }
          uVar5 = (*cubeb_sio_pollfd)(*(sio_hdl **)((long)arg + 0x40),(pollfd *)__fds,(int)bVar2);
          if ((int)uVar5 < 1) {
LAB_00120f1d:
            uVar5 = (*cubeb_sio_revents)(*(sio_hdl **)((long)arg + 0x40),(pollfd *)__fds);
            uVar12 = 3;
            if ((uVar5 & 0x10) != 0) goto LAB_00121052;
            if ((uVar5 & 4) != 0) {
              sVar9 = (*cubeb_sio_write)(*(sio_hdl **)((long)arg + 0x40),
                                         (void *)(*(long *)((long)arg + 0x60) + uVar13),
                                         local_40 - uVar13);
              if (((int)sVar9 == 0) &&
                 (iVar4 = (*cubeb_sio_eof)(*(sio_hdl **)((long)arg + 0x40)), iVar4 != 0))
              goto LAB_00121052;
              uVar13 = uVar13 + (long)(int)sVar9;
            }
            if ((uVar5 & 1) != 0) {
              sVar9 = (*cubeb_sio_read)(*(sio_hdl **)((long)arg + 0x40),
                                        (void *)(*(long *)((long)arg + 0x58) + uVar15),
                                        uVar11 - uVar15);
              if (((int)sVar9 == 0) &&
                 (iVar4 = (*cubeb_sio_eof)(*(sio_hdl **)((long)arg + 0x40)), iVar4 != 0))
              goto LAB_00121052;
              uVar15 = uVar15 + (long)(int)sVar9;
            }
            if ((0 < iVar16) && ((*(byte *)((long)arg + 0x48) & 2) != 0)) {
              uVar15 = uVar11;
            }
          }
          else {
            pthread_mutex_unlock(__mutex);
            iVar4 = poll(__fds,(ulong)uVar5,-1);
            pthread_mutex_lock(__mutex);
            if (-1 < iVar4) goto LAB_00120f1d;
          }
        } while (*(int *)((long)arg + 0x4c) != 0);
      }
      uVar12 = 1;
LAB_00121052:
      (*cubeb_sio_stop)(*(sio_hdl **)((long)arg + 0x40));
      *(undefined8 *)((long)arg + 0x80) = *(undefined8 *)((long)arg + 0x88);
      pthread_mutex_unlock(__mutex);
      (**(code **)((long)arg + 0x98))(arg,*(undefined8 *)((long)arg + 8),uVar12);
    }
    free(__fds);
  }
  return (void *)0x0;
}

Assistant:

static void *
sndio_mainloop(void *arg)
{
  struct pollfd *pfds;
  cubeb_stream *s = arg;
  int n, eof = 0, prime, nfds, events, revents, state = CUBEB_STATE_STARTED;
  size_t pstart = 0, pend = 0, rstart = 0, rend = 0;
  long nfr;

  nfds = WRAP(sio_nfds)(s->hdl);
  pfds = calloc(nfds, sizeof (struct pollfd));
  if (pfds == NULL)
	  return NULL;

  DPR("sndio_mainloop()\n");
  s->state_cb(s, s->arg, CUBEB_STATE_STARTED);
  pthread_mutex_lock(&s->mtx);
  if (!WRAP(sio_start)(s->hdl)) {
    pthread_mutex_unlock(&s->mtx);
    free(pfds);
    return NULL;
  }
  DPR("sndio_mainloop(), started\n");

  if (s->mode & SIO_PLAY) {
    pstart = pend = s->nfr * s->pbpf;
    prime = s->nblks;
    if (s->mode & SIO_REC) {
      memset(s->rbuf, 0, s->nfr * s->rbpf);
      rstart = rend = s->nfr * s->rbpf;
    }
  } else {
    prime = 0;
    rstart = 0;
    rend = s->nfr * s->rbpf;
  }

  for (;;) {
    if (!s->active) {
      DPR("sndio_mainloop() stopped\n");
      state = CUBEB_STATE_STOPPED;
      break;
    }

    /* do we have a complete block? */
    if ((!(s->mode & SIO_PLAY) || pstart == pend) &&
	(!(s->mode & SIO_REC) || rstart == rend)) {

      if (eof) {
        DPR("sndio_mainloop() drained\n");
        state = CUBEB_STATE_DRAINED;
        break;
      }

      if ((s->mode & SIO_REC) && s->conv)
        s16_to_float(s->rbuf, s->nfr * s->rchan);

      /* invoke call-back, it returns less that s->nfr if done */
      pthread_mutex_unlock(&s->mtx);
      nfr = s->data_cb(s, s->arg, s->rbuf, s->pbuf, s->nfr);
      pthread_mutex_lock(&s->mtx);
      if (nfr < 0) {
        DPR("sndio_mainloop() cb err\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      s->swpos += nfr;

      /* was this last call-back invocation (aka end-of-stream) ? */
      if (nfr < s->nfr) {

        if (!(s->mode & SIO_PLAY) || nfr == 0) {
          state = CUBEB_STATE_DRAINED;
          break;
	}

        /* need to write (aka drain) the partial play block we got */
        pend = nfr * s->pbpf;
        eof = 1;
      }

      if (prime > 0)
        prime--;

      if (s->mode & SIO_PLAY) {
        if (s->conv)
          float_to_s16(s->pbuf, nfr * s->pchan, s->volume);
        else
          s16_setvol(s->pbuf, nfr * s->pchan, s->volume);
      }

      if (s->mode & SIO_REC)
        rstart = 0;
      if (s->mode & SIO_PLAY)
        pstart = 0;
    }

    events = 0;
    if ((s->mode & SIO_REC) && rstart < rend && prime == 0)
      events |= POLLIN;
    if ((s->mode & SIO_PLAY) && pstart < pend)
      events |= POLLOUT;
    nfds = WRAP(sio_pollfd)(s->hdl, pfds, events);

    if (nfds > 0) {
      pthread_mutex_unlock(&s->mtx);
      n = poll(pfds, nfds, -1);
      pthread_mutex_lock(&s->mtx);
      if (n < 0)
        continue;
    }

    revents = WRAP(sio_revents)(s->hdl, pfds);

    if (revents & POLLHUP) {
      state = CUBEB_STATE_ERROR;
      break;
    }

    if (revents & POLLOUT) {
      n = WRAP(sio_write)(s->hdl, s->pbuf + pstart, pend - pstart);
      if (n == 0 && WRAP(sio_eof)(s->hdl)) {
        DPR("sndio_mainloop() werr\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      pstart += n;
    }

    if (revents & POLLIN) {
      n = WRAP(sio_read)(s->hdl, s->rbuf + rstart, rend - rstart);
      if (n == 0 && WRAP(sio_eof)(s->hdl)) {
        DPR("sndio_mainloop() rerr\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      rstart += n;
    }

    /* skip rec block, if not recording (yet) */
    if (prime > 0 && (s->mode & SIO_REC))
      rstart = rend;
  }
  WRAP(sio_stop)(s->hdl);
  s->hwpos = s->swpos;
  pthread_mutex_unlock(&s->mtx);
  s->state_cb(s, s->arg, state);
  free(pfds);
  return NULL;
}